

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool setFontFamilyFromValues(QList<QCss::Value> *values,QFont *font,int start)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_78.size = 0;
  lVar1 = (long)start;
  lVar2 = lVar1 * 0x28 + 8;
  bVar3 = false;
  do {
    if ((values->d).size <= lVar1) {
LAB_005420cc:
      if (local_58.size != 0) {
        QList<QString>::emplaceBack<QString_const&>
                  ((QList<QString> *)&local_78,(QString *)&local_58);
      }
      if (local_78.size != 0) {
        QFont::setFamilies(font,(QStringList *)&local_78);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return SUB81(*(long *)(in_FS_OFFSET + 0x28),0);
      }
      __stack_chk_fail();
    }
    bVar4 = *(int *)((long)(values->d).ptr + lVar2 + -8) == 0xb;
    if (bVar4) {
      QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_78,(QString *)&local_58);
      QString::clear((QString *)&local_58);
    }
    else {
      local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QVariant::toString();
      if ((undefined1 *)local_98.size == (undefined1 *)0x0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        goto LAB_005420cc;
      }
      if (bVar3) {
        QString::append((QChar)(char16_t)&local_58);
      }
      QString::append((QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    }
    lVar1 = lVar1 + 1;
    lVar2 = lVar2 + 0x28;
    bVar3 = !bVar4;
  } while( true );
}

Assistant:

static bool setFontFamilyFromValues(const QList<QCss::Value> &values, QFont *font, int start = 0)
{
    QString family;
    QStringList families;
    bool shouldAddSpace = false;
    for (int i = start; i < values.size(); ++i) {
        const QCss::Value &v = values.at(i);
        if (v.type == Value::TermOperatorComma) {
            families << family;
            family.clear();
            shouldAddSpace = false;
            continue;
        }
        const QString str = v.variant.toString();
        if (str.isEmpty())
            break;
        if (shouldAddSpace)
            family += u' ';
        family += str;
        shouldAddSpace = true;
    }
    if (!family.isEmpty())
        families << family;
    if (families.isEmpty())
        return false;
    font->setFamilies(families);
    return true;
}